

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_open_filename.c
# Opt level: O1

int64_t file_skip(archive_conflict *a,void *client_data,int64_t request)

{
  int error_number;
  __off_t _Var1;
  int *piVar2;
  __off_t _Var3;
  char *fmt;
  read_file_data *mine;
  
  if (*(char *)((long)client_data + 0x28) == '\0') {
    return 0;
  }
  _Var1 = lseek(*client_data,0,1);
  if (-1 < _Var1) {
    if (*(long *)((long)client_data + 0x20) - _Var1 < request ||
        *(long *)((long)client_data + 0x20) <= _Var1) {
      piVar2 = __errno_location();
      *piVar2 = 0x1d;
    }
    else {
      _Var3 = lseek(*client_data,request,1);
      if (-1 < _Var3) {
        return _Var3 - _Var1;
      }
    }
  }
  *(undefined1 *)((long)client_data + 0x28) = 0;
  piVar2 = __errno_location();
  error_number = *piVar2;
  if (error_number != 0x1d) {
    if (*(int *)((long)client_data + 0x2c) == 1) {
      fmt = "Error seeking in \'%s\'";
    }
    else {
      if (*(int *)((long)client_data + 0x2c) == 0) {
        archive_set_error((archive *)a,error_number,"Error seeking in stdin");
        return -1;
      }
      fmt = "Error seeking in \'%ls\'";
    }
    archive_set_error((archive *)a,error_number,fmt,(long)client_data + 0x30);
    return -1;
  }
  return 0;
}

Assistant:

static int64_t
file_skip(struct archive *a, void *client_data, int64_t request)
{
	struct read_file_data *mine = (struct read_file_data *)client_data;

	/* Delegate skip requests. */
	if (mine->use_lseek)
		return (file_skip_lseek(a, client_data, request));

	/* If we can't skip, return 0; libarchive will read+discard instead. */
	return (0);
}